

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  _Elt_pointer pUVar3;
  value_type *pvVar4;
  string *psVar5;
  bool bVar6;
  BOM BVar7;
  string *psVar8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  iterator iVar11;
  long *plVar12;
  iterator iVar13;
  iterator iVar14;
  mapped_type *this_00;
  ostream *poVar15;
  _Rb_tree_node_base *p_Var16;
  ulong *puVar17;
  UnscannedEntry *inc;
  _Rb_tree_header *p_Var18;
  value_type *__x;
  string fullName;
  string dir;
  UnscannedEntry current;
  string binDir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string obj_i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string obj_m;
  int local_39c;
  key_type local_398;
  ostream *local_378;
  ostream *local_370;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  string local_320;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_300;
  string local_2f8;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t local_2b0;
  string local_2a8;
  _Base_ptr local_288;
  _Base_ptr local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  *local_278;
  RegularExpression *local_270;
  undefined1 local_268 [16];
  _Base_ptr local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree_node_base *local_248;
  size_t local_240;
  value_type local_238 [8];
  
  local_378 = makeDepends;
  local_370 = internalDepends;
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without a source file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  else {
    if (obj->_M_string_length != 0) {
      local_250 = (_Rb_tree_node_base *)(local_268 + 8);
      local_268._8_4_ = 0;
      local_258 = (_Base_ptr)0x0;
      local_240 = 0;
      local_248 = local_250;
      psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((this->super_cmDepends).LocalGenerator);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,pcVar1,pcVar1 + psVar8->_M_string_length);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&local_2a8,(this->super_cmDepends).LocalGenerator,&local_2f8,obj);
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x0) ||
         (cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::find(&this->ValidDeps->_M_t,&local_2a8),
         (_Rb_tree_header *)cVar9._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
         ) {
        local_39c = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        local_368 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&this->Encountered;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368);
        p_Var10 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var18 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var18) {
          do {
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            local_238[0].FileName._M_string_length = 0;
            local_238[0].FileName.field_2._M_allocated_capacity =
                 local_238[0].FileName.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_238[0].QuotedLocation._M_dataplus._M_p =
                 (pointer)&local_238[0].QuotedLocation.field_2;
            local_238[0].QuotedLocation._M_string_length = 0;
            local_238[0].QuotedLocation.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)local_238);
            std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
            push_back(&(this->Unscanned).c,local_238);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].QuotedLocation._M_dataplus._M_p !=
                &local_238[0].QuotedLocation.field_2) {
              operator_delete(local_238[0].QuotedLocation._M_dataplus._M_p,
                              CONCAT71(local_238[0].QuotedLocation.field_2._M_allocated_capacity.
                                       _1_7_,local_238[0].QuotedLocation.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var18);
        }
        local_2d8._24_8_ = local_2d8 + 8;
        local_2d8._8_4_ = _S_red;
        local_2d8._16_8_ = (_Base_ptr)0x0;
        local_2b0 = 0;
        local_300 = &this->HeaderLocationCache;
        local_288 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_270 = &this->IncludeRegexComplain;
        local_278 = &this->FileCache;
        local_280 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_2b8 = (_Base_ptr)local_2d8._24_8_;
        do {
          pUVar3 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar3) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2d8);
            goto LAB_004206ea;
          }
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          pcVar1 = (pUVar3->FileName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,pcVar1,pcVar1 + (pUVar3->FileName)._M_string_length);
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          pcVar1 = (pUVar3->QuotedLocation)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_320,pcVar1,pcVar1 + (pUVar3->QuotedLocation)._M_string_length)
          ;
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&(this->Unscanned).c);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          local_398._M_string_length = 0;
          local_398.field_2._M_local_buf[0] = '\0';
          if ((0 < local_39c) || (bVar6 = cmsys::SystemTools::FileIsFullPath(&local_340), bVar6)) {
            bVar6 = cmsys::SystemTools::FileExists(&local_340,true);
            if (bVar6) goto LAB_00420290;
          }
          else if ((local_320._M_string_length == 0) ||
                  (bVar6 = cmsys::SystemTools::FileExists(&local_320,true), !bVar6)) {
            iVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&local_300->_M_t,&local_340);
            if (iVar14._M_node == local_288) {
              psVar5 = (this->super_cmDepends).IncludePath.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (psVar8 = (this->super_cmDepends).IncludePath.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar5;
                  psVar8 = psVar8 + 1) {
                cmsys::SystemTools::CollapseFullPath(&local_238[0].FileName,&local_340,psVar8);
                bVar6 = cmsys::SystemTools::FileExists(&local_238[0].FileName,true);
                if (bVar6) {
                  std::__cxx11::string::_M_assign((string *)&local_398);
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_300,&local_340);
                  std::__cxx11::string::operator=((string *)this_00,(string *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
                  }
                  break;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                  operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                  local_238[0].FileName.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_398);
            }
          }
          else {
LAB_00420290:
            std::__cxx11::string::_M_assign((string *)&local_398);
          }
          if (local_398._M_string_length == 0) {
            bVar6 = cmsys::RegularExpression::find
                              (local_270,local_340._M_dataplus._M_p,&local_270->regmatch);
            if (!bVar6) {
              if (local_398._M_string_length != 0) goto LAB_004202a6;
              goto LAB_004202c9;
            }
            std::operator+(&local_360,"Cannot find file \"",&local_340);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_360);
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            puVar17 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_238[0].FileName.field_2._0_8_ = *puVar17;
              local_238[0].FileName.field_2._8_8_ = plVar12[3];
            }
            else {
              local_238[0].FileName.field_2._0_8_ = *puVar17;
              local_238[0].FileName._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_238[0].FileName._M_string_length = plVar12[1];
            *plVar12 = (long)puVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            cmSystemTools::Error(&local_238[0].FileName);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            bVar6 = false;
          }
          else {
LAB_004202a6:
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2d8,&local_398);
            if (iVar11._M_node == (_Base_ptr)(local_2d8 + 8)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_2d8,&local_398);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                       ::find(&local_278->_M_t,&local_398);
              if (iVar13._M_node == local_280) {
                std::ifstream::ifstream(local_238,local_398._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&local_238[0].QuotedLocation._M_dataplus._M_p +
                               *(long *)(local_238[0].FileName._M_dataplus._M_p + -0x18)) & 5) == 0)
                   && (BVar7 = cmsys::FStream::ReadBOM((istream *)local_238), BVar7 < BOM_UTF16BE))
                {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_268,&local_398);
                  cmsys::SystemTools::GetFilenamePath(&local_360,&local_398);
                  Scan(this,(istream *)local_238,&local_360,&local_398);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p,
                                    local_360.field_2._M_allocated_capacity + 1);
                  }
                }
                std::ifstream::~ifstream(local_238);
              }
              else {
                *(undefined1 *)(*(long *)(iVar13._M_node + 2) + 0x18) = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_268,&local_398);
                pvVar4 = (value_type *)(*(undefined8 **)(iVar13._M_node + 2))[1];
                for (__x = (value_type *)**(undefined8 **)(iVar13._M_node + 2); __x != pvVar4;
                    __x = __x + 1) {
                  iVar11 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_368,&__x->FileName);
                  if ((_Rb_tree_header *)iVar11._M_node ==
                      &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>(local_368,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&(this->Unscanned).c,__x);
                  }
                }
              }
            }
LAB_004202c9:
            local_39c = local_39c + -1;
            bVar6 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,
                            CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                     local_398.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        } while (bVar6);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d8);
        bVar6 = false;
      }
      else {
        p_Var10 = *(_Base_ptr *)(cVar9._M_node + 2);
        p_Var2 = cVar9._M_node[2]._M_parent;
        local_238[0].FileName._M_dataplus._M_p = local_268;
        if (p_Var10 != p_Var2) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_268,(_Base_ptr)(local_268 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var10,
                       (_Alloc_node *)local_238);
            p_Var10 = p_Var10 + 1;
          } while (p_Var10 != p_Var2);
        }
LAB_004206ea:
        cmSystemTools::ConvertToOutputPath(&local_238[0].FileName,&local_2a8);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_370,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        if (local_250 != (_Rb_tree_node_base *)(local_268 + 8)) {
          p_Var16 = local_250;
          do {
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_378,local_238[0].FileName._M_dataplus._M_p,
                                 local_238[0].FileName._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
            cmLocalGenerator::MaybeConvertToRelativePath
                      ((string *)local_2d8,(this->super_cmDepends).LocalGenerator,&local_2f8,
                       (string *)(p_Var16 + 1));
            cmSystemTools::ConvertToOutputPath(&local_340,(string *)local_2d8);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_340._M_dataplus._M_p,local_340._M_string_length);
            std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_370," ",1);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_370,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent);
            std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != (_Rb_tree_node_base *)(local_268 + 8));
        }
        std::ios::widen((char)local_378->_vptr_basic_ostream[-3] + (char)local_378);
        std::ostream::put((char)local_378);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
          operator_delete(local_238[0].FileName._M_dataplus._M_p,
                          local_238[0].FileName.field_2._M_allocated_capacity + 1);
        }
        bVar6 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
      return bVar6;
    }
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without an object file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  std::string binDir = this->LocalGenerator->GetBinaryDirectory();

  // Compute a path to the object file to write to the internal depend file.
  // Any existing content of the internal depend file has already been
  // loaded in ValidDeps with this path as a key.
  std::string obj_i =
    this->LocalGenerator->MaybeConvertToRelativePath(binDir, obj);

  if (this->ValidDeps != nullptr) {
    auto const tmpIt = this->ValidDeps->find(obj_i);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = static_cast<int>(sources.size());
    this->Encountered.clear();

    for (std::string const& src : sources) {
      UnscannedEntry root;
      root.FileName = src;
      this->Unscanned.push(root);
      this->Encountered.insert(src);
    }

    std::set<std::string> scanned;
    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) || cmSystemTools::FileIsFullPath(current.FileName)) {
        if (cmSystemTools::FileExists(current.FileName, true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation, true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        auto headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::string const& iPath : this->IncludePath) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".
            std::string tmpPath =
              cmSystemTools::CollapseFullPath(current.FileName, iPath);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tmpPath, true)) {
              fullName = tmpPath;
              this->HeaderLocationCache[current.FileName] = std::move(tmpPath);
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName)) {
        cmSystemTools::Error("Cannot find file \"" + current.FileName + "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        auto fileIt = this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second->Used = true;
          dependencies.insert(fullName);
          for (UnscannedEntry const& inc : fileIt->second->UnscannedEntries) {
            if (this->Encountered.find(inc.FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(inc.FileName);
              this->Unscanned.push(inc);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir, fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << std::endl;

  for (std::string const& dep : dependencies) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->LocalGenerator->MaybeConvertToRelativePath(binDir,
                                                                      dep))
                << std::endl;
    internalDepends << " " << dep << std::endl;
  }
  makeDepends << std::endl;

  return true;
}